

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_symbol_table.c
# Opt level: O0

boolean l2_symbol_table_add_symbol_integer(l2_symbol_node **head_p,char *symbol_name,int integer)

{
  l2_symbol_node *plVar1;
  _l2_symbol_node *p_Var2;
  l2_symbol_node *local_30;
  l2_symbol_node *current_p;
  int integer_local;
  char *symbol_name_local;
  l2_symbol_node **head_p_local;
  
  plVar1 = l2_symbol_table_get_symbol_node_by_name_in_symbol_table(*head_p,symbol_name);
  if (plVar1 == (l2_symbol_node *)0x0) {
    local_30 = *head_p;
    if (*head_p == (l2_symbol_node *)0x0) {
      plVar1 = (l2_symbol_node *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x28);
      *head_p = plVar1;
      (*head_p)->next = (_l2_symbol_node *)0x0;
      ((*head_p)->symbol).symbol_name = symbol_name;
      ((*head_p)->symbol).type = L2_SYMBOL_TYPE_INTEGER;
      ((*head_p)->symbol).u.integer = integer;
      head_p_local._7_1_ = '\x01';
    }
    else {
      for (; local_30->next != (_l2_symbol_node *)0x0; local_30 = local_30->next) {
      }
      p_Var2 = (_l2_symbol_node *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x28);
      local_30->next = p_Var2;
      local_30->next->next = (_l2_symbol_node *)0x0;
      (local_30->next->symbol).symbol_name = symbol_name;
      (local_30->next->symbol).type = L2_SYMBOL_TYPE_INTEGER;
      (local_30->next->symbol).u.integer = integer;
      head_p_local._7_1_ = '\x01';
    }
  }
  else {
    head_p_local._7_1_ = '\0';
  }
  return head_p_local._7_1_;
}

Assistant:

boolean l2_symbol_table_add_symbol_integer(l2_symbol_node **head_p, char *symbol_name, int integer) {

    /* judge the symbol if already defined before */
    if (l2_symbol_table_get_symbol_node_by_name_in_symbol_table(*head_p, symbol_name) != L2_NULL_PTR) return L2_FALSE;
    l2_symbol_node *current_p = *head_p;

    if (*head_p == L2_NULL_PTR) {
        *head_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_symbol_node));
        (*head_p)->next = L2_NULL_PTR;
        (*head_p)->symbol.symbol_name = symbol_name;
        (*head_p)->symbol.type = L2_SYMBOL_TYPE_INTEGER;
        (*head_p)->symbol.u.integer = integer;
        return L2_TRUE;
    }

    while (current_p->next) {
        current_p = current_p->next;
    }
    current_p->next = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_symbol_node));
    current_p->next->next = L2_NULL_PTR;
    current_p->next->symbol.symbol_name = symbol_name;
    current_p->next->symbol.type = L2_SYMBOL_TYPE_INTEGER;
    current_p->next->symbol.u.integer = integer;
    return L2_TRUE;
}